

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O2

void randomx_release_cache(randomx_cache *cache)

{
  (*cache->dealloc)(cache);
  randomx_cache::~randomx_cache(cache);
  operator_delete(cache);
  return;
}

Assistant:

void randomx_release_cache(randomx_cache* cache) {
		assert(cache != nullptr);
		cache->dealloc(cache);
		delete cache;
	}